

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O3

FabSet * __thiscall
amrex::FabSet::linComb
          (FabSet *this,Real a,MultiFab *mfa,int a_comp,Real b,MultiFab *mfb,int b_comp,int dcomp,
          int ncomp,int ngrow)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  long lVar1;
  ulong uVar2;
  Periodicity *pPVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  Array4<double> afab;
  MFIter mfi;
  Array4<double> bfab;
  Box local_38c;
  Array4<double> dfab;
  MultiFab bdryb;
  MultiFab bdrya;
  
  bxs = &(this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray;
  dm = &(this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap;
  bdryb.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x1;
  bdryb.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
  bdryb.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
  bdryb.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
  bdryb.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       &PTR__FabFactory_00712918;
  MultiFab::MultiFab(&bdrya,bxs,dm,ncomp,0,(MFInfo *)&bdryb,(FabFactory<amrex::FArrayBox> *)&mfi);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&bdryb.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  afab.p = (double *)&PTR__FabFactory_00712918;
  MultiFab::MultiFab(&bdryb,bxs,dm,ncomp,0,(MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&afab);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  MFIter::MFIter(&mfi,(FabArrayBase *)&bdrya,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      BATransformer::operator()
                ((Box *)&dfab,&((mfi.fabArray)->boxarray).m_bat,
                 (Box *)((long)((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[mfi.currentIndex] * 0x1c +
                        *(long *)&((((mfi.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&afab,&bdrya.super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&bfab,&bdryb.super_FabArray<amrex::FArrayBox>,&mfi);
      if (0 < ncomp) {
        lVar6 = (long)dfab.p._4_4_;
        local_4e8 = 0;
        uVar2 = 0;
        do {
          iVar5 = (int)dfab.jstride;
          if ((int)dfab.jstride <= dfab.kstride._4_4_) {
            do {
              if (dfab.p._4_4_ <= (int)dfab.kstride) {
                lVar1 = (long)bfab.p +
                        bfab.nstride * local_4e8 +
                        (lVar6 - bfab.begin.y) * bfab.jstride * 8 +
                        ((long)iVar5 - (long)bfab.begin.z) * bfab.kstride * 8 +
                        (long)bfab.begin.x * -8 + (long)(int)dfab.p * 8;
                lVar11 = CONCAT44(afab.jstride._4_4_,(undefined4)afab.jstride) * 8;
                lVar7 = (long)afab.p +
                        afab.nstride * local_4e8 +
                        (lVar6 - afab.begin.y) * lVar11 +
                        ((long)iVar5 - (long)afab.begin.z) * afab.kstride * 8 +
                        (long)afab.begin.x * -8 + (long)(int)dfab.p * 8;
                lVar4 = lVar6;
                do {
                  if ((int)dfab.p <= dfab.jstride._4_4_) {
                    lVar8 = 0;
                    do {
                      *(undefined8 *)(lVar7 + lVar8 * 8) = 0x6974e718d7d7625a;
                      *(undefined8 *)(lVar1 + lVar8 * 8) = 0x6974e718d7d7625a;
                      lVar8 = lVar8 + 1;
                    } while ((dfab.jstride._4_4_ - (int)dfab.p) + 1 != (int)lVar8);
                  }
                  lVar4 = lVar4 + 1;
                  lVar1 = lVar1 + bfab.jstride * 8;
                  lVar7 = lVar7 + lVar11;
                } while ((int)dfab.kstride + 1 != (int)lVar4);
              }
              bVar13 = iVar5 != dfab.kstride._4_4_;
              iVar5 = iVar5 + 1;
            } while (bVar13);
          }
          uVar2 = uVar2 + 1;
          local_4e8 = local_4e8 + 8;
        } while (uVar2 != (uint)ncomp);
      }
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  pPVar3 = Periodicity::NonPeriodic();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = ngrow;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = ngrow;
  mfi.fabArray = (FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,ngrow);
  afab.p = (double *)0x0;
  afab.jstride._0_4_ = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&bdrya.super_FabArray<amrex::FArrayBox>,&mfa->super_FabArray<amrex::FArrayBox>,a_comp,0
             ,ncomp,(IntVect *)&mfi,(IntVect *)&afab,pPVar3,COPY,(CPC *)0x0,false);
  pPVar3 = Periodicity::NonPeriodic();
  mfi.fabArray = (FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,ngrow);
  afab.p = (double *)0x0;
  afab.jstride._0_4_ = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&bdryb.super_FabArray<amrex::FArrayBox>,&mfb->super_FabArray<amrex::FArrayBox>,b_comp,0
             ,ncomp,(IntVect *)&mfi,(IntVect *)&afab,pPVar3,COPY,(CPC *)0x0,false);
  MFIter::MFIter(&mfi,(FabArrayBase *)this,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      BATransformer::operator()
                (&local_38c,&((mfi.fabArray)->boxarray).m_bat,
                 (Box *)((long)((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[mfi.currentIndex] * 0x1c +
                        *(long *)&((((mfi.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&afab,&bdrya.super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&bfab,&bdryb.super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&dfab,(FabArray<amrex::FArrayBox> *)this,&mfi);
      if (0 < ncomp) {
        lVar6 = (long)local_38c.smallend.vect[1];
        lVar4 = (long)local_38c.smallend.vect[0] * 8;
        local_4d8 = 0;
        uVar2 = 0;
        local_4e0 = (long)dcomp << 3;
        do {
          iVar5 = local_38c.smallend.vect[2];
          if (local_38c.smallend.vect[2] <= local_38c.bigend.vect[2]) {
            do {
              if (local_38c.smallend.vect[1] <= local_38c.bigend.vect[1]) {
                lVar1 = (long)iVar5;
                lVar10 = CONCAT44(dfab.jstride._4_4_,(int)dfab.jstride) * 8;
                lVar11 = dfab.nstride * local_4e0 +
                         (lVar1 - dfab.begin.z) * CONCAT44(dfab.kstride._4_4_,(int)dfab.kstride) * 8
                         + (lVar6 - dfab.begin.y) * lVar10 + (long)dfab.begin.x * -8 +
                         CONCAT44(dfab.p._4_4_,(int)dfab.p) + lVar4;
                lVar9 = (long)bfab.p +
                        bfab.nstride * local_4d8 +
                        (lVar6 - bfab.begin.y) * bfab.jstride * 8 +
                        (lVar1 - bfab.begin.z) * bfab.kstride * 8 + (long)bfab.begin.x * -8 + lVar4;
                lVar8 = CONCAT44(afab.jstride._4_4_,(undefined4)afab.jstride) * 8;
                lVar7 = (long)afab.p +
                        afab.nstride * local_4d8 +
                        (lVar6 - afab.begin.y) * lVar8 + (lVar1 - afab.begin.z) * afab.kstride * 8 +
                        (long)afab.begin.x * -8 + lVar4;
                lVar1 = lVar6;
                do {
                  if (local_38c.smallend.vect[0] <= local_38c.bigend.vect[0]) {
                    lVar12 = 0;
                    do {
                      *(double *)(lVar11 + lVar12 * 8) =
                           *(double *)(lVar7 + lVar12 * 8) * a + *(double *)(lVar9 + lVar12 * 8) * b
                      ;
                      lVar12 = lVar12 + 1;
                    } while ((local_38c.bigend.vect[0] - local_38c.smallend.vect[0]) + 1 !=
                             (int)lVar12);
                  }
                  lVar1 = lVar1 + 1;
                  lVar11 = lVar11 + lVar10;
                  lVar9 = lVar9 + bfab.jstride * 8;
                  lVar7 = lVar7 + lVar8;
                } while (local_38c.bigend.vect[1] + 1 != (int)lVar1);
              }
              bVar13 = iVar5 != local_38c.bigend.vect[2];
              iVar5 = iVar5 + 1;
            } while (bVar13);
          }
          uVar2 = uVar2 + 1;
          local_4e0 = local_4e0 + 8;
          local_4d8 = local_4d8 + 8;
        } while (uVar2 != (uint)ncomp);
      }
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  MultiFab::~MultiFab(&bdryb);
  MultiFab::~MultiFab(&bdrya);
  return this;
}

Assistant:

FabSet&
FabSet::linComb (Real a, const MultiFab& mfa, int a_comp,
                 Real b, const MultiFab& mfb, int b_comp,
                 int dcomp, int ncomp, int ngrow)
{
    BL_PROFILE("FabSet::linComb()");
    BL_ASSERT(ngrow <= mfa.nGrow());
    BL_ASSERT(ngrow <= mfb.nGrow());
    BL_ASSERT(mfa.boxArray() == mfb.boxArray());
    BL_ASSERT(boxArray() != mfa.boxArray());

    MultiFab bdrya(boxArray(),DistributionMap(),ncomp,0,MFInfo(),FArrayBoxFactory());
    MultiFab bdryb(boxArray(),DistributionMap(),ncomp,0,MFInfo(),FArrayBoxFactory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(bdrya); mfi.isValid(); ++mfi) // tiling is not safe for this BoxArray
    {
        const Box& bx = mfi.validbox();
        auto afab = bdrya.array(mfi);
        auto bfab = bdryb.array(mfi);
#ifdef AMREX_USE_FLOAT
        const Real huge = 1.e30f;
#else
        const Real huge = 1.e200;
#endif
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            afab(i,j,k,n) = huge;
            bfab(i,j,k,n) = huge;
        });
    }

    bdrya.ParallelCopy(mfa,a_comp,0,ncomp,ngrow,0);
    bdryb.ParallelCopy(mfb,b_comp,0,ncomp,ngrow,0);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (FabSetIter fsi(*this); fsi.isValid(); ++fsi)
    {
        const Box& bx = fsi.validbox();
        auto const afab = bdrya.array(fsi);
        auto const bfab = bdryb.array(fsi);
        auto       dfab = this->array(fsi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            dfab(i,j,k,n+dcomp) = a*afab(i,j,k,n) + b*bfab(i,j,k,n);
        });
    }

    return *this;
}